

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cauchy_256.cpp
# Opt level: O0

void gaussian_elimination(int rows,Block **recovery,u64 *bitmatrix,int bitstride,int subbytes)

{
  int iVar1;
  int iVar2;
  ulong *vy;
  void *vx;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  int in_R8D;
  u8 *dest;
  int ii;
  u64 *other;
  u8 *data;
  u8 *src;
  int option;
  u64 *row;
  u64 *offset;
  int pivot_word;
  int pivot;
  u64 *base;
  u64 mask;
  int bit_rows;
  int local_74;
  ulong *local_70;
  uint local_54;
  ulong *local_50;
  uint local_3c;
  long local_38;
  ulong local_30;
  
  iVar1 = in_EDI * 8;
  local_30 = 1;
  local_3c = 0;
  local_38 = in_RDX;
  do {
    if (iVar1 + -1 <= (int)local_3c) {
      return;
    }
    iVar2 = (int)local_3c >> 6;
    vy = (ulong *)(local_38 + (long)iVar2 * 8);
    local_54 = local_3c;
    local_50 = vy;
    while( true ) {
      if (iVar1 <= (int)local_54) goto LAB_0010433f;
      if ((*local_50 & local_30) != 0) break;
      local_54 = local_54 + 1;
      local_50 = local_50 + in_ECX;
    }
    vx = (void *)(**(long **)(in_RSI + (long)((int)local_3c >> 3) * 8) +
                 (long)(int)((local_3c & 7) * in_R8D));
    if (local_54 != local_3c) {
      cat::memswap(vx,(void *)(**(long **)(in_RSI + (long)((int)local_54 >> 3) * 8) +
                              (long)(int)((local_54 & 7) * in_R8D)),in_R8D);
      cat::memswap(local_50,vy,(in_ECX - iVar2) * 8);
    }
    local_70 = local_50;
    while (local_54 = local_54 + 1, (int)local_54 < iVar1) {
      local_70 = local_70 + in_ECX;
      if ((*local_70 & local_30) != 0) {
        *local_70 = *vy ^ *local_70;
        for (local_74 = 1; local_74 < in_ECX - iVar2; local_74 = local_74 + 1) {
          local_70[local_74] = vy[local_74] ^ local_70[local_74];
        }
        cat::memxor((void *)(**(long **)(in_RSI + (long)((int)local_54 >> 3) * 8) +
                            (long)(int)((local_54 & 7) * in_R8D)),vx,in_R8D);
      }
    }
LAB_0010433f:
    local_3c = local_3c + 1;
    local_30 = local_30 << 1 | local_30 >> 0x3f;
    local_38 = local_38 + (long)in_ECX * 8;
  } while( true );
}

Assistant:

static void gaussian_elimination(int rows, Block *recovery[256], u64 *bitmatrix,
								 int bitstride, int subbytes)
{
	const int bit_rows = rows * 8;
	u64 mask = 1;
	u64 *base = bitmatrix;

	// For each pivot to find,
	for (int pivot = 0; pivot < bit_rows - 1; ++pivot, mask = CAT_ROL64(mask, 1), base += bitstride) {
		const int pivot_word = pivot >> 6;
		u64 *offset = base + pivot_word;
		u64 *row = offset;

		// For each option,
		for (int option = pivot; option < bit_rows; ++option, row += bitstride) {
			// If bit in this row is set,
			if (row[0] & mask) {
				// Prepare to add in data
				DLOG(cout << "Found pivot " << pivot << endl;)
				DLOG(print_matrix(bitmatrix, bitstride, bit_rows);)

				u8 *src = recovery[pivot >> 3]->data + (pivot & 7) * subbytes;

				// If the rows were out of order,
				if (option != pivot) {
					u8 *data = recovery[option >> 3]->data + (option & 7) * subbytes;

					// Reorder data into the right place
					memswap(src, data, subbytes);

					// Reorder matrix rows
					memswap(row, offset, (bitstride - pivot_word) << 3);
				}

				// For each other row,
				u64 *other = row;
				while (++option < bit_rows) {
					other += bitstride;

					// If that row also has the bit set,
					if (other[0] & mask) {
						DLOG(cout << "Eliminating from row " << option << endl;)

						other[0] ^= offset[0];

						// For each remaining word,
						for (int ii = 1; ii < bitstride - pivot_word; ++ii) {
							other[ii] ^= offset[ii];
						}

						// Add in the data
						u8 *dest = recovery[option >> 3]->data + (option & 7) * subbytes;

						memxor(dest, src, subbytes);
					}
				}

				// Stop here
				break;
			}
		}
	}
}